

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::InitializeInternal(cmCPackArchiveGenerator *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  char *msg;
  string local_268 [32];
  undefined1 local_248 [8];
  ostringstream cmCPackLog_msg;
  char local_c9;
  string local_c8;
  string_view local_a8;
  undefined1 local_98 [8];
  string newExtension;
  string local_70;
  cmValue local_50;
  cmValue newExtensionValue;
  allocator<char> local_31;
  string local_30;
  cmCPackArchiveGenerator *local_10;
  cmCPackArchiveGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"1");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CPACK_ARCHIVE_FILE_EXTENSION",
             (allocator<char> *)(newExtension.field_2._M_local_buf + 0xf));
  local_50 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(newExtension.field_2._M_local_buf + 0xf));
  bVar1 = cmValue::IsEmpty(&local_50);
  if (!bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_50);
    std::__cxx11::string::string((string *)local_98,(string *)psVar3);
    local_a8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
    bVar1 = cmHasLiteralPrefix<2ul>(local_a8,(char (*) [2])0x103c0c8);
    if (!bVar1) {
      local_c9 = '.';
      cmStrCat<char,std::__cxx11::string&>
                (&local_c8,&local_c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    poVar4 = std::operator<<((ostream *)local_248,"Using user-provided file extension ");
    poVar4 = std::operator<<(poVar4,(string *)local_98);
    poVar4 = std::operator<<(poVar4," instead of the default ");
    poVar4 = std::operator<<(poVar4,(string *)&this->OutputExtension);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xdf,msg);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
    std::__cxx11::string::operator=((string *)&this->OutputExtension,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackArchiveGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "1");
  cmValue newExtensionValue = this->GetOption("CPACK_ARCHIVE_FILE_EXTENSION");
  if (!newExtensionValue.IsEmpty()) {
    std::string newExtension = *newExtensionValue;
    if (!cmHasLiteralPrefix(newExtension, ".")) {
      newExtension = cmStrCat('.', newExtension);
    }
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Using user-provided file extension "
                    << newExtension << " instead of the default "
                    << this->OutputExtension << std::endl);
    this->OutputExtension = std::move(newExtension);
  }
  return this->Superclass::InitializeInternal();
}